

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_factory.cc
# Opt level: O1

unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
__thiscall sentencepiece::ModelFactory::Create(ModelFactory *this,ModelProto *model_proto)

{
  int iVar1;
  ulong in_RAX;
  Model *this_00;
  ostream *this_01;
  undefined1 *puVar2;
  undefined8 uStack_28;
  
  puVar2 = (undefined1 *)model_proto->trainer_spec_;
  if ((TrainerSpec *)puVar2 == (TrainerSpec *)0x0) {
    puVar2 = _TrainerSpec_default_instance_;
  }
  switch(((TrainerSpec *)puVar2)->model_type_) {
  case 1:
    this_00 = (Model *)operator_new(0xb0);
    unigram::Model::Model(this_00,model_proto);
    break;
  case 2:
    this_00 = (Model *)operator_new(0x98);
    bpe::Model::Model((Model *)this_00,model_proto);
    break;
  case 3:
    this_00 = (Model *)operator_new(0x98);
    word::Model::Model((Model *)this_00,model_proto);
    break;
  case 4:
    this_00 = (Model *)operator_new(0x98);
    character::Model::Model((Model *)this_00,model_proto);
    break;
  default:
    uStack_28 = in_RAX;
    iVar1 = logging::GetMinLogLevel();
    if (iVar1 < 3) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"model_factory.cc",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      this_01 = (ostream *)std::ostream::operator<<(&std::cerr,0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,"LOG(",4);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,"ERROR",5);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,"Unknown model_type: ",0x14);
      std::ostream::operator<<(this_01,((TrainerSpec *)puVar2)->model_type_);
      error::Die::~Die((Die *)((long)&uStack_28 + 7));
    }
    *(undefined8 *)this = 0;
    this_00 = (Model *)0x0;
  }
  *(Model **)this = this_00;
  return (__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
          )(__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ModelInterface> ModelFactory::Create(
    const ModelProto& model_proto) {
  const auto& trainer_spec = model_proto.trainer_spec();

  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Model>(model_proto);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Model>(model_proto);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Model>(model_proto);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Model>(model_proto);
      break;
    default:
      LOG(ERROR) << "Unknown model_type: " << trainer_spec.model_type();
      return nullptr;
      break;
  }

  return std::make_unique<unigram::Model>(model_proto);
}